

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::InverseKinematicsConstraintSet
          (InverseKinematicsConstraintSet *this)

{
  long in_RDI;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffe0;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffffe0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)(in_RDI + 0x18));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x860bd3);
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::vector((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
            *)0x860be3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x860bf4);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)0x860c05);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)0x860c16);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::vector
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)0x860c27);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x860c38);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x860c49);
  *(undefined8 *)(in_RDI + 0x48) = 0x3e112e0be826d695;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 300;
  *(undefined8 *)(in_RDI + 0x58) = 0x3d719799812dea11;
  *(undefined8 *)(in_RDI + 0x60) = 0x3d719799812dea11;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

RBDL_DLLAPI
InverseKinematicsConstraintSet::InverseKinematicsConstraintSet() {
  lambda = 1e-9;
  num_steps = 0;
  max_steps = 300;
  step_tol = 1e-12;
  constraint_tol = 1e-12;
  num_constraints = 0;
}